

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtlsbackend.cpp
# Opt level: O2

QByteArray * __thiscall
QTlsPrivate::TlsKey::pemFooter(QByteArray *__return_storage_ptr__,TlsKey *this)

{
  int iVar1;
  char *pcVar2;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = (*this->_vptr_TlsKey[10])(this);
  if (iVar1 == 1) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = "-----END PUBLIC KEY-----";
    (__return_storage_ptr__->d).size = 0x18;
  }
  else {
    iVar1 = (*this->_vptr_TlsKey[0xb])(this);
    if (iVar1 == 1) {
      (__return_storage_ptr__->d).d = (Data *)0x0;
      pcVar2 = "-----END RSA PRIVATE KEY-----";
    }
    else {
      iVar1 = (*this->_vptr_TlsKey[0xb])(this);
      if (iVar1 != 2) {
        iVar1 = (*this->_vptr_TlsKey[0xb])(this);
        if (iVar1 == 3) {
          (__return_storage_ptr__->d).d = (Data *)0x0;
          (__return_storage_ptr__->d).ptr = "-----END EC PRIVATE KEY-----";
          (__return_storage_ptr__->d).size = 0x1c;
        }
        else {
          (*this->_vptr_TlsKey[0xb])(this);
          (__return_storage_ptr__->d).d = (Data *)0x0;
          (__return_storage_ptr__->d).ptr = "-----END PRIVATE KEY-----";
          (__return_storage_ptr__->d).size = 0x19;
        }
        goto LAB_001c40d6;
      }
      (__return_storage_ptr__->d).d = (Data *)0x0;
      pcVar2 = "-----END DSA PRIVATE KEY-----";
    }
    (__return_storage_ptr__->d).ptr = pcVar2;
    (__return_storage_ptr__->d).size = 0x1d;
  }
LAB_001c40d6:
  local_30.size = 0;
  local_30.ptr = (char *)0x0;
  local_30.d = (Data *)0x0;
  QArrayDataPointer<char>::~QArrayDataPointer(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QByteArray TlsKey::pemFooter() const
{
    if (type() == QSsl::PublicKey)
        return QByteArrayLiteral("-----END PUBLIC KEY-----");
    else if (algorithm() == QSsl::Rsa)
        return QByteArrayLiteral("-----END RSA PRIVATE KEY-----");
    else if (algorithm() == QSsl::Dsa)
        return QByteArrayLiteral("-----END DSA PRIVATE KEY-----");
    else if (algorithm() == QSsl::Ec)
        return QByteArrayLiteral("-----END EC PRIVATE KEY-----");
    else if (algorithm() == QSsl::Dh)
        return QByteArrayLiteral("-----END PRIVATE KEY-----");

    Q_UNREACHABLE_RETURN({});
}